

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void AssertCorrectModifiersInTemplate(Template *tpl,string *text,string *expected_out)

{
  bool bVar1;
  string local_a0 [32];
  undefined8 local_80;
  size_type j;
  size_type i;
  string local_60 [8];
  string out;
  string local_40 [8];
  string dump_out;
  string *expected_out_local;
  string *text_local;
  Template *tpl_local;
  
  if (tpl == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0xea,"tpl");
    __assert_fail("tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0xea,
                  "void AssertCorrectModifiersInTemplate(Template *, const string &, const string &)"
                 );
  }
  std::__cxx11::string::string(local_40);
  std::__cxx11::string::string(local_60);
  ctemplate::Template::DumpToString((char *)tpl,(string *)"bogus_filename");
  j = 0;
  while (j = std::__cxx11::string::find((char *)local_40,0x13ea3f), j != 0xffffffffffffffff) {
    j = j + 0xf;
    local_80 = std::__cxx11::string::find((char *)local_40,0x13c3de);
    std::__cxx11::string::substr((ulong)local_a0,(ulong)local_40);
    std::__cxx11::string::append(local_60);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::append((char *)local_60);
  }
  bVar1 = anon_unknown.dwarf_a67e::StrEqVerbose(expected_out,(string *)local_60,text);
  if (bVar1) {
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0xf5,"StrEqVerbose(expected_out, out, text)");
  bVar1 = anon_unknown.dwarf_a67e::StrEqVerbose(expected_out,(string *)local_60,text);
  if (bVar1) {
    exit(1);
  }
  __assert_fail("StrEqVerbose(expected_out, out, text)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0xf5,
                "void AssertCorrectModifiersInTemplate(Template *, const string &, const string &)")
  ;
}

Assistant:

static void AssertCorrectModifiersInTemplate(Template* tpl,
                                             const string& text,
                                             const string& expected_out) {
  ASSERT(tpl);
  string dump_out, out;
  tpl->DumpToString("bogus_filename", &dump_out);
  string::size_type i, j;
  i = 0;
  while ((i = dump_out.find("Variable Node: ", i)) != string::npos) {
    i += strlen("Variable Node: ");
    j = dump_out.find("\n", i);
    out.append(dump_out.substr(i, j - i));   // should be safe.
    out.append("\n");
  }
  ASSERT_STREQ_VERBOSE(expected_out, out, text);
}